

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall ClassReg::SetupClass(ClassReg *this,PClass *cls)

{
  int iVar1;
  
  if (this->MyClass == (PClass *)0x0) {
    this->MyClass = cls;
    iVar1 = FName::NameManager::FindName(&FName::NameData,this->Name + 1,false);
    (cls->super_PStruct).super_PNamedType.TypeName.Index = iVar1;
    *(uint *)&(cls->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
              field_0x24 = *(uint *)&this->field_0x28 & 0xfffffff;
    cls->Pointers = this->Pointers;
    cls->ConstructNative = this->ConstructNative;
    return;
  }
  __assert_fail("MyClass == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xbe7,"void ClassReg::SetupClass(PClass *)");
}

Assistant:

void ClassReg::SetupClass(PClass *cls)
{
	assert(MyClass == NULL);
	MyClass = cls;
	cls->TypeName = FName(Name+1);
	cls->Size = SizeOf;
	cls->Pointers = Pointers;
	cls->ConstructNative = ConstructNative;
}